

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ParenPragmaExpressionSyntax::ParenPragmaExpressionSyntax
          (ParenPragmaExpressionSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *values,Token closeParen)

{
  bool bVar1;
  size_t in_RDX;
  SyntaxNode *in_RSI;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *in_RDI;
  pointer in_R8;
  size_t in_R9;
  PragmaExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *in_stack_ffffffffffffffa0;
  
  PragmaExpressionSyntax::PragmaExpressionSyntax
            ((PragmaExpressionSyntax *)in_stack_ffffffffffffffa0,(SyntaxKind)((ulong)in_RDI >> 0x20)
            );
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = in_RSI;
  (in_RDI->super_SyntaxListBase).childCount = in_RDX;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffffa0,in_RDI);
  in_RDI[1].elements._M_ptr = in_R8;
  in_RDI[1].elements._M_extent._M_extent_value = in_R9;
  in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x383506);
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffa0,
                       (iterator_base<slang::syntax::PragmaExpressionSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_false>
                      *)0x383545);
    *(SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> **)
     &(in_stack_ffffffffffffffa0->super_SyntaxListBase).super_SyntaxNode = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_false>
                *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

ParenPragmaExpressionSyntax(Token openParen, const SeparatedSyntaxList<PragmaExpressionSyntax>& values, Token closeParen) :
        PragmaExpressionSyntax(SyntaxKind::ParenPragmaExpression), openParen(openParen), values(values), closeParen(closeParen) {
        this->values.parent = this;
        for (auto child : this->values)
            child->parent = this;
    }